

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O2

uint32_t __thiscall
ddd::DaTrie<false,_false,_false>::excheck_
          (DaTrie<false,_false,_false> *this,Edge *edge,
          vector<ddd::Block,_std::allocator<ddd::Block>_> *blocks)

{
  bool bVar1;
  uint32_t uVar2;
  pointer pBVar3;
  uint base;
  ulong uVar4;
  uint32_t uVar5;
  
  uVar2 = this->head_pos_;
  if (uVar2 != 0xffffffff) {
    pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = (long)(this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pBVar3;
    uVar5 = uVar2;
    do {
      if (uVar5 < (int)(uVar4 >> 3) - 0x100U) {
        base = edge->labels_[0] ^ uVar5;
        bVar1 = is_target_ex_(this,base,edge);
        if (bVar1) {
          this->head_pos_ = uVar5;
          return base;
        }
        pBVar3 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar2 = this->head_pos_;
      }
      uVar5 = *(uint *)(pBVar3 + uVar5) & 0x7fffffff;
    } while (uVar5 != uVar2);
  }
  return 0xffffffff;
}

Assistant:

uint32_t excheck_(const Edge& edge, const std::vector<Block>& blocks) {
    if (head_pos_ == NOT_FOUND) {
      return NOT_FOUND;
    }

    auto upper_limit = bc_size() - BLOCK_SIZE;
    auto node_pos = head_pos_;

    do {
      if (upper_limit <= node_pos) {
        continue;
      }
      auto base = node_pos ^*edge.begin();
      if (is_target_ex_(base, edge)) {
        head_pos_ = node_pos; // update for remaining
        return base;
      }
    } while ((node_pos = next_(node_pos)) != head_pos_);

    return NOT_FOUND;
  }